

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O3

itype * __thiscall
pybind11::detail::type_caster_base::operator_cast_to_Data_(type_caster_base *this)

{
  reference_cast_error *this_00;
  
  if (*(itype **)(this + 0x10) != (itype *)0x0) {
    return *(itype **)(this + 0x10);
  }
  this_00 = (reference_cast_error *)__cxa_allocate_exception(0x10);
  reference_cast_error::reference_cast_error(this_00);
  __cxa_throw(this_00,&reference_cast_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

operator itype &() {
        if (!value) {
            throw reference_cast_error();
        }
        return *((itype *) value);
    }